

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O3

short * __thiscall
cubeb_resampler_speex_one_way<short>::output
          (cubeb_resampler_speex_one_way<short> *this,size_t output_frame_count,
          size_t *input_frames_used)

{
  size_t *psVar1;
  short *psVar2;
  cubeb_log_level cVar3;
  uint uVar4;
  cubeb_log_callback p_Var5;
  ulong uVar7;
  ulong uVar8;
  uint32_t out_len;
  uint32_t in_len;
  uint local_30;
  uint local_2c;
  ulong uVar6;
  
  uVar8 = (ulong)(this->super_processor).channels;
  if ((this->resampling_out_buffer).capacity_ < uVar8 * output_frame_count) {
    auto_array<short>::reserve(&this->resampling_out_buffer,uVar8 * output_frame_count);
    uVar8 = (ulong)(this->super_processor).channels;
  }
  local_2c = (uint)((this->resampling_in_buffer).length_ / uVar8);
  local_30 = (uint)output_frame_count;
  speex_resampler_process_interleaved_int
            (this->speex_resampler,(this->resampling_in_buffer).data_,&local_2c,
             (this->resampling_out_buffer).data_,&local_30);
  if (local_30 < output_frame_count) {
    cVar3 = cubeb_log_get_level();
    if ((1 < (int)cVar3) && (p_Var5 = cubeb_log_get_callback(), p_Var5 != (cubeb_log_callback)0x0))
    {
      cubeb_log_internal("cubeb_resampler_internal.h",0x113,
                         "underrun during resampling: got %u frames, expected %zu",(ulong)local_30,
                         output_frame_count);
    }
    uVar4 = (this->super_processor).channels;
    uVar8 = (ulong)uVar4;
    uVar4 = local_30 * uVar4;
    uVar6 = (ulong)uVar4;
    uVar7 = output_frame_count * uVar8;
    if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
      psVar2 = (this->resampling_out_buffer).data_;
      do {
        uVar4 = uVar4 + 1;
        psVar2[uVar6] = 0;
        uVar6 = (ulong)uVar4;
      } while (uVar6 <= uVar7 && uVar7 - uVar6 != 0);
    }
  }
  else {
    uVar8 = (ulong)(this->super_processor).channels;
  }
  uVar7 = (ulong)local_2c;
  uVar8 = uVar8 * uVar7;
  uVar6 = (this->resampling_in_buffer).length_;
  if ((uVar8 <= uVar6) && (psVar2 = (this->resampling_in_buffer).data_, psVar2 != (short *)0x0)) {
    memmove(psVar2,psVar2 + uVar8,(uVar6 - uVar8) * 2);
    psVar1 = &(this->resampling_in_buffer).length_;
    *psVar1 = *psVar1 - uVar8;
    uVar7 = (ulong)local_2c;
  }
  *input_frames_used = uVar7;
  return (this->resampling_out_buffer).data_;
}

Assistant:

T * output(size_t output_frame_count, size_t * input_frames_used)
  {
    if (resampling_out_buffer.capacity() <
        frames_to_samples(output_frame_count)) {
      resampling_out_buffer.reserve(frames_to_samples(output_frame_count));
    }

    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len,
                   resampling_out_buffer.data(), &out_len);

    if (out_len < output_frame_count) {
      LOGV("underrun during resampling: got %u frames, expected %zu",
           (unsigned)out_len, output_frame_count);
      // silence the rightmost part
      T * data = resampling_out_buffer.data();
      for (uint32_t i = frames_to_samples(out_len);
           i < frames_to_samples(output_frame_count); i++) {
        data[i] = 0;
      }
    }

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));
    *input_frames_used = in_len;

    return resampling_out_buffer.data();
  }